

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::SubtractPropagateStatistics::Operation<int,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Value local_70;
  
  iVar1 = NumericStats::GetMin<int>(lstats);
  iVar2 = NumericStats::GetMax<int>(rstats);
  if (iVar2 < 0) {
    if (iVar2 + 999999999 < iVar1) {
      return true;
    }
  }
  else if (iVar1 < iVar2 + -999999999) {
    return true;
  }
  iVar3 = NumericStats::GetMax<int>(lstats);
  iVar4 = NumericStats::GetMin<int>(rstats);
  if (iVar4 < 0) {
    if (iVar4 + 999999999 < iVar3) {
      return true;
    }
  }
  else if (iVar3 < iVar4 + -999999999) {
    return true;
  }
  Value::Numeric(&local_70,type,(long)(iVar1 - iVar2));
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)(iVar3 - iVar4));
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return false;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}